

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

PClassActor * CreateNewActor(FScriptPosition *sc,FName *typeName,FName *parentName)

{
  int iVar1;
  bool bVar2;
  PClassActor *pPVar3;
  PClassActor *pPVar4;
  char *message;
  FName local_30;
  FName local_2c;
  
  pPVar3 = (PClassActor *)AActor::RegistrationInfo.MyClass;
  if (parentName->Index != 0) {
    local_2c.Index = parentName->Index;
    pPVar3 = PClass::FindActor(&local_2c);
    for (pPVar4 = pPVar3; pPVar4 != (PClassActor *)0x0;
        pPVar4 = dyn_cast<PClassActor>((DObject *)(pPVar4->super_PClass).ParentClass)) {
      iVar1 = (pPVar4->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
              Index;
      if (iVar1 == typeName->Index) {
        FScriptPosition::Message
                  (sc,2,"\'%s\' inherits from a class with the same name",
                   FName::NameData.NameArray[iVar1].Text);
        break;
      }
    }
    if (pPVar3 == (PClassActor *)0x0) {
      message = "Parent type \'%s\' not found in %s";
    }
    else {
      bVar2 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,&pPVar3->super_PClass);
      if (bVar2) goto LAB_00520143;
      message = "Parent type \'%s\' is not an actor in %s";
    }
    FScriptPosition::Message
              (sc,2,message,FName::NameData.NameArray[parentName->Index].Text,
               FName::NameData.NameArray[typeName->Index].Text);
    pPVar3 = (PClassActor *)AActor::RegistrationInfo.MyClass;
  }
LAB_00520143:
  local_30 = (FName)typeName->Index;
  pPVar3 = DecoDerivedClass(sc,pPVar3,&local_30);
  (pPVar3->super_PClass).bDecorateClass = true;
  pPVar3->Replacement = (PClassActor *)0x0;
  pPVar3->Replacee = (PClassActor *)0x0;
  pPVar3->DoomEdNum = -1;
  return pPVar3;
}

Assistant:

PClassActor *CreateNewActor(const FScriptPosition &sc, FName typeName, FName parentName)
{
	PClassActor *replacee = NULL;
	PClassActor *ti = NULL;

	PClassActor *parent = RUNTIME_CLASS(AActor);

	if (parentName != NAME_None)
	{
		parent = PClass::FindActor(parentName);

		PClassActor *p = parent;
		while (p != NULL)
		{
			if (p->TypeName == typeName)
			{
				sc.Message(MSG_ERROR, "'%s' inherits from a class with the same name", typeName.GetChars());
				break;
			}
			p = dyn_cast<PClassActor>(p->ParentClass);
		}

		if (parent == NULL)
		{
			sc.Message(MSG_ERROR, "Parent type '%s' not found in %s", parentName.GetChars(), typeName.GetChars());
			parent = RUNTIME_CLASS(AActor);
		}
		else if (!parent->IsDescendantOf(RUNTIME_CLASS(AActor)))
		{
			sc.Message(MSG_ERROR, "Parent type '%s' is not an actor in %s", parentName.GetChars(), typeName.GetChars());
			parent = RUNTIME_CLASS(AActor);
		}
	}
	ti = DecoDerivedClass(sc, parent, typeName);
	ti->bDecorateClass = true;	// we only set this for 'modern' DECORATE. The original stuff  is so limited that it cannot do anything that may require flagging.

	ti->Replacee = ti->Replacement = NULL;
	ti->DoomEdNum = -1;
	return ti;
}